

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void increase_comb_counter_in_groups
               (size_t *ix_arr,size_t st,size_t end,size_t split_ix,size_t n,double *counter,
               double *weights,double exp_remainder)

{
  size_t sVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  size_t ix1;
  
  puVar2 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (ix_arr + st,ix_arr + end + 1);
  uVar3 = ((long)puVar2 - (long)(ix_arr + st) >> 3) + st;
  if (exp_remainder <= 1.0) {
    for (; uVar4 = uVar3, st < uVar3; st = st + 1) {
      for (; uVar4 <= end; uVar4 = uVar4 + 1) {
        sVar1 = ix_arr[uVar4];
        lVar5 = ix_arr[st] * (n - split_ix) - split_ix;
        counter[lVar5 + sVar1] = weights[ix_arr[st]] * weights[sVar1] + counter[lVar5 + sVar1];
      }
    }
  }
  else {
    for (; uVar4 = uVar3, st < uVar3; st = st + 1) {
      for (; uVar4 <= end; uVar4 = uVar4 + 1) {
        sVar1 = ix_arr[uVar4];
        lVar5 = ix_arr[st] * (n - split_ix) - split_ix;
        counter[lVar5 + sVar1] =
             weights[ix_arr[st]] * weights[sVar1] * exp_remainder + counter[lVar5 + sVar1];
      }
    }
  }
  return;
}

Assistant:

void increase_comb_counter_in_groups(size_t ix_arr[], size_t st, size_t end, size_t split_ix, size_t n,
                                     double *restrict counter, double *restrict weights, double exp_remainder)
{
    size_t *ptr_split_ix = std::lower_bound(ix_arr + st, ix_arr + end + 1, split_ix);
    size_t n_group = std::distance(ix_arr + st, ptr_split_ix);
    n = n - split_ix;

    if (exp_remainder <= 1)
        for (size_t ix1 = st; ix1 < st + n_group; ix1++)
            for (size_t ix2 = st + n_group; ix2 <= end; ix2++)
                counter[ix_arr[ix1] * n + ix_arr[ix2] - split_ix]
                    +=
                weights[ix_arr[ix1]] * weights[ix_arr[ix2]];
    else
        for (size_t ix1 = st; ix1 < st + n_group; ix1++)
            for (size_t ix2 = st + n_group; ix2 <= end; ix2++)
                counter[ix_arr[ix1] * n + ix_arr[ix2] - split_ix]
                    +=
                weights[ix_arr[ix1]] * weights[ix_arr[ix2]] * exp_remainder;
}